

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_conversions.hpp
# Opt level: O0

shared_ptr<chaiscript::detail::Type_Conversion_Base> __thiscall
chaiscript::Type_Conversions::get_conversion(Type_Conversions *this,Type_Info *to,Type_Info *from)

{
  bool bVar1;
  reference psVar2;
  out_of_range *this_00;
  char *pcVar3;
  Type_Info *in_RCX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<chaiscript::detail::Type_Conversion_Base> sVar4;
  allocator<char> local_d9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  _Self local_58 [3];
  _Self local_40;
  const_iterator itr;
  shared_lock<chaiscript::detail::threading::shared_mutex> l;
  Type_Info *from_local;
  Type_Info *to_local;
  Type_Conversions *this_local;
  
  std::shared_lock<std::shared_mutex>::shared_lock
            ((shared_lock<std::shared_mutex> *)&itr,(mutex_type *)to);
  local_40._M_node = (_Base_ptr)find((Type_Conversions *)to,from,in_RCX);
  local_58[0]._M_node =
       (_Base_ptr)
       std::
       set<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>,_std::less<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>_>,_std::allocator<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>_>_>
       ::end((set<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>,_std::less<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>_>,_std::allocator<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>_>_>
              *)&to[2].m_bare_type_info);
  bVar1 = std::operator==(&local_40,local_58);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d8,"No such conversion exists from ",&local_d9);
    pcVar3 = Type_Info::bare_name(in_RCX);
    std::operator+(&local_b8,&local_d8,pcVar3);
    std::operator+(&local_98,&local_b8," to ");
    pcVar3 = Type_Info::bare_name(from);
    std::operator+(&local_78,&local_98,pcVar3);
    std::out_of_range::out_of_range(this_00,(string *)&local_78);
    __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
  }
  psVar2 = std::_Rb_tree_const_iterator<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>_>
           ::operator*(&local_40);
  std::shared_ptr<chaiscript::detail::Type_Conversion_Base>::shared_ptr
            ((shared_ptr<chaiscript::detail::Type_Conversion_Base> *)this,psVar2);
  std::shared_lock<std::shared_mutex>::~shared_lock((shared_lock<std::shared_mutex> *)&itr);
  sVar4.super___shared_ptr<chaiscript::detail::Type_Conversion_Base,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  sVar4.super___shared_ptr<chaiscript::detail::Type_Conversion_Base,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)this;
  return (shared_ptr<chaiscript::detail::Type_Conversion_Base>)
         sVar4.
         super___shared_ptr<chaiscript::detail::Type_Conversion_Base,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<detail::Type_Conversion_Base> get_conversion(const Type_Info &to, const Type_Info &from) const {
      chaiscript::detail::threading::shared_lock<chaiscript::detail::threading::shared_mutex> l(m_mutex);

      const auto itr = find(to, from);

      if (itr != m_conversions.end()) {
        return *itr;
      } else {
        throw std::out_of_range(std::string("No such conversion exists from ") + from.bare_name() + " to " + to.bare_name());
      }
    }